

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

void __thiscall SimpleLogger::~SimpleLogger(SimpleLogger *this)

{
  pointer pLVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 uVar4;
  
  stop(this);
  pLVar1 = (this->logs).
           super__Vector_base<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pLVar1 != (pointer)0x0) {
    operator_delete(pLVar1);
  }
  uVar4 = _pthread_mutex_unlock;
  lVar3 = _VTT;
  *(long *)&this->fs = _VTT;
  *(undefined8 *)(&this->fs + *(long *)(lVar3 + -0x18)) = uVar4;
  std::filebuf::~filebuf((filebuf *)&this->field_0x40);
  std::ios_base::~ios_base((ios_base *)&this->field_0x130);
  pcVar2 = (this->filePath)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->filePath).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

SimpleLogger::~SimpleLogger() {
    stop();
}